

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O1

void __thiscall OnDiskIndex::prefetch(OnDiskIndex *this,TriGram trigram)

{
  __off_t in_R8;
  uint64_t ptrs [2];
  long local_28;
  long local_20;
  
  RawFile::pread(&this->ndxfile,(int)&local_28,(void *)0x10,
                 (this->index_size + (ulong)trigram * 8) - 0x8000008,in_R8);
  RawFile::prefetch(&this->ndxfile,local_20 - local_28,local_28);
  return;
}

Assistant:

void OnDiskIndex::prefetch(TriGram trigram) const {
    std::pair<uint64_t, uint64_t> offsets = get_run_offsets(trigram);
    uint64_t length = offsets.second - offsets.first;
    ndxfile.prefetch(length, offsets.first);
}